

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

MakeNet * __thiscall notch::core::MakeNet::addActivation(MakeNet *this,Activation *af)

{
  MakeLayer mk;
  LayerType local_4c;
  value_type local_48;
  
  checkConfig(this);
  local_48.nInputs = this->nOutputs;
  local_48.maybeWeights.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_48.maybeWeights.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48.maybeBias.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.maybeBias.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48.nOutputs = local_48.nInputs;
  local_48.maybeActivation = af;
  std::vector<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>::push_back
            (&this->layerMakers,&local_48);
  local_4c = FC;
  std::vector<notch::core::MakeNet::LayerType,_std::allocator<notch::core::MakeNet::LayerType>_>::
  emplace_back<notch::core::MakeNet::LayerType>(&this->layerTypes,&local_4c);
  MakeLayer::~MakeLayer(&local_48);
  return this;
}

Assistant:

MakeNet &addActivation(const Activation &af) {
        checkConfig();
        MakeLayer mk(nOutputs, af);
        layerMakers.push_back(mk);
        layerTypes.push_back(LayerType::FC);
        return *this;
    }